

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-whisper.cpp
# Opt level: O2

string * to_timestamp_abi_cxx11_(string *__return_storage_ptr__,int64_t t,bool comma)

{
  ulong uVar1;
  undefined7 in_register_00000011;
  long lVar2;
  long lVar3;
  char *pcVar4;
  allocator<char> local_39;
  char buf [32];
  
  lVar2 = (t / 360000) * -3600000 + t * 10;
  lVar3 = lVar2 % 60000;
  uVar1 = lVar3 / 1000;
  pcVar4 = ".";
  if ((int)CONCAT71(in_register_00000011,comma) != 0) {
    pcVar4 = ",";
  }
  snprintf(buf,0x20,"%02d:%02d:%02d%s%03d",t / 360000,lVar2 / 60000 & 0xffffffff,uVar1 & 0xffffffff,
           pcVar4,(ulong)(uint)((int)lVar3 + (int)uVar1 * -1000));
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,buf,&local_39)
  ;
  return __return_storage_ptr__;
}

Assistant:

std::string to_timestamp(int64_t t, bool comma) {
    int64_t msec = t * 10;
    int64_t hr = msec / (1000 * 60 * 60);
    msec = msec - hr * (1000 * 60 * 60);
    int64_t min = msec / (1000 * 60);
    msec = msec - min * (1000 * 60);
    int64_t sec = msec / 1000;
    msec = msec - sec * 1000;

    char buf[32];
    snprintf(buf, sizeof(buf), "%02d:%02d:%02d%s%03d", (int) hr, (int) min, (int) sec, comma ? "," : ".", (int) msec);

    return std::string(buf);
}